

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

double max_diff(vec *a,vec *b)

{
  size_type sVar1;
  vec *pvVar2;
  double extraout_XMM0_Qa;
  double diff;
  double dStack_20;
  uint i;
  double max_diff;
  vec *b_local;
  vec *a_local;
  
  dStack_20 = 0.0;
  diff._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(a);
    if (sVar1 <= diff._4_4_) break;
    std::vector<double,_std::allocator<double>_>::operator[](a,(ulong)diff._4_4_);
    pvVar2 = b;
    std::vector<double,_std::allocator<double>_>::operator[](b,(ulong)diff._4_4_);
    std::abs((int)pvVar2);
    if (dStack_20 < extraout_XMM0_Qa) {
      dStack_20 = extraout_XMM0_Qa;
    }
    diff._4_4_ = diff._4_4_ + 1;
  }
  return dStack_20;
}

Assistant:

double max_diff(const vec& a, const vec& b)
{
    double max_diff = 0.0;
    for (unsigned int i = 0; i < a.size(); i++)
    {
        double diff = std::abs(a[i] - b[i]);
        if (diff > max_diff)
        {
            max_diff = diff;
        }
    }

    return max_diff;
}